

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O2

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar6 = container2->cardinality;
  if (iVar6 == -1) {
    iVar6 = bitset_container_compute_cardinality(container2);
  }
  iVar7 = run_container_cardinality(container1);
  if (iVar6 < iVar7) {
LAB_00117ce6:
    bVar5 = false;
  }
  else {
    uVar2 = container1->n_runs;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      uVar1 = container1->runs[uVar8].value;
      uVar10 = (ulong)uVar1;
      while ((uint)uVar10 <= (uint)container1->runs[uVar8].length + (uint)uVar1) {
        uVar4 = uVar10 >> 3;
        uVar3 = uVar10 & 0x3f;
        uVar10 = (ulong)((uint)uVar10 + 1);
        if ((*(ulong *)((long)container2->words + (ulong)((uint)uVar4 & 0x1ff8)) >> uVar3 & 1) == 0)
        goto LAB_00117ce6;
      }
    }
    bVar5 = (long)(int)uVar2 <= (long)uVar8;
  }
  return bVar5;
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}